

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

void __thiscall libDAI::MaxPlus::calcNewMessage(MaxPlus *this,size_t iI)

{
  TProb<double> *this_00;
  pointer pvVar1;
  pointer pTVar2;
  pointer pdVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar7;
  long lVar8;
  Var *n;
  VarSet *ns;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  long *plVar14;
  size_t i_1;
  long *plVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar18 [16];
  undefined1 extraout_var_00 [56];
  Prob sum;
  Index i_newm;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  size_t local_b0;
  long local_a8;
  Index local_a0;
  VarSet local_50;
  long *plVar6;
  undefined1 auVar19 [64];
  
  iVar5 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  lVar11 = *(long *)(plVar6[8] + iI * 0x10);
  lVar13 = *(long *)(plVar6[8] + 8 + iI * 0x10);
  local_b0 = iI;
  if (5 < (this->Props).verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"new Mess F");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," -> v");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  lVar8 = (**(code **)(*plVar6 + 0x50))(plVar6,lVar13);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_c8,
             (vector<double,_std::allocator<double>_> *)(lVar8 + 0x20));
  lVar8 = plVar6[0x11];
  lVar9 = lVar13 * 0x18;
  local_a8 = lVar9;
  for (plVar15 = *(long **)(lVar8 + lVar9); sVar4 = local_b0,
      plVar15 != *(long **)(lVar8 + 8 + lVar9); plVar15 = plVar15 + 1) {
    if (*plVar15 != lVar11) {
      lVar8 = *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*plVar15].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + lVar13 * 8);
      pvVar1 = (this->_indices).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = (**(code **)(*plVar6 + 0x30))(plVar6);
      TProb<double>::TProb((TProb<double> *)&local_a0,*(size_t *)(lVar9 + 8),0.0);
      lVar9 = *plVar15;
      lVar10 = plVar6[0xe];
      for (plVar14 = *(long **)(lVar10 + lVar9 * 0x18);
          plVar14 != *(long **)(lVar10 + 8 + lVar9 * 0x18); plVar14 = plVar14 + 1) {
        if (*plVar14 != lVar13) {
          TProb<double>::operator+=
                    ((TProb<double> *)&local_a0,
                     (this->_messages).
                     super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data + *plVar14 * 8));
          lVar9 = *plVar15;
          lVar10 = plVar6[0xe];
        }
      }
      for (lVar9 = 0;
          (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_c8._M_impl.super__Vector_impl_data._M_start >> 3 != lVar9; lVar9 = lVar9 + 1)
      {
        local_c8._M_impl.super__Vector_impl_data._M_start[lVar9] =
             *(double *)
              (local_a0._index +
              *(long *)(*(long *)&pvVar1[lVar8].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + lVar9 * 8) * 8) +
             local_c8._M_impl.super__Vector_impl_data._M_start[lVar9];
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_a0);
      lVar8 = plVar6[0x11];
      lVar9 = local_a8;
    }
  }
  pTVar2 = (this->_newmessages).
           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = pTVar2 + local_b0;
  lVar8 = *(long *)&pTVar2[local_b0]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl;
  pdVar3 = pTVar2[local_b0]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar12 = 0; uVar12 < (ulong)((long)pdVar3 - lVar8 >> 3); uVar12 = uVar12 + 1) {
    *(undefined8 *)(lVar8 + uVar12 * 8) = 0xfff0000000000000;
  }
  n = (Var *)(**(code **)(*plVar6 + 0x30))(plVar6,lVar11);
  VarSet::VarSet(&local_50,n);
  ns = (VarSet *)(**(code **)(*plVar6 + 0x50))(plVar6,lVar13);
  auVar19._8_56_ = extraout_var_00;
  auVar19._0_8_ = extraout_XMM1_Qa;
  Index::Index(&local_a0,&local_50,ns);
  uVar12 = 0;
  while( true ) {
    auVar18 = auVar19._0_16_;
    if ((ulong)((long)local_c8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar12) break;
    pdVar3 = (this_00->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_c8._M_impl.super__Vector_impl_data._M_start[uVar12];
    uVar12 = uVar12 + 1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = pdVar3[local_a0._index];
    auVar18 = vmaxsd_avx(auVar17,auVar18);
    pdVar3[local_a0._index] = auVar18._0_8_;
    Index::operator++(&local_a0);
  }
  dVar16 = TProb<double>::totalSum(this_00);
  pdVar3 = (this_00->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = 0;
  lVar11 = (long)(this_00->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
  auVar18 = vcvtusi2sd_avx512f(auVar18,lVar11);
  for (; lVar11 != lVar13; lVar13 = lVar13 + 1) {
    pdVar3[lVar13] = pdVar3[lVar13] - dVar16 / auVar18._0_8_;
  }
  if (5 < (this->Props).verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"\tnew Mess F");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," -> v");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = libDAI::operator<<(poVar7,(this->_newmessages).
                                       super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + sVar4);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  Index::~Index(&local_a0);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
  return;
}

Assistant:

void MaxPlus::calcNewMessage (size_t iI) 
    { 
        const FactorGraph& g = grm();
        //FRANS: iI is the index of the edge in the factorgraph...
        //this function calculates the updated message I->i
        size_t i = g.edge(iI).first;    //FRANS: here we get the index of the variable (? 'first' type) corresponding to edge iI
        size_t I = g.edge(iI).second;   //FRANS: here we get the index of the factor (? the 'second' type) corresponding to edge iI
        ///FRANS: indeed 1st=var, 2nd=Factor, see "typedef BipartiteGraph<Var,Factor> BipFacGraph;" in factorgraph.h, 38
        if( Props.verbose >= 6)
            cout << "new Mess F"<< I <<" -> v"<< i<<endl;

        Prob sum( g.factor(I).p() );

        //if( Props.verbose >= 8)
        //cout<<"\tInitialized sum = " << sum << endl;

        //FRANS: nbF(I)  returns a list to neighbors of Factor I (of the 
        // graph.model) (implementation-wise this list is a vector<size_t> )
        //FRANS: FactorGraph::nb_cit is a typedef provides an iterator of 
        // the list of neighbors
        //Prob & m; //can we make this a reference?
        for( FactorGraph::nb_cit j = g.nbF(I).begin(); j != g.nbF(I).end(); j++ )   
            if( *j != i ) {     // for all j in I \ i                                       
                //if( Props.verbose >= 5)
                    //cout << "\t\tneighbor variable v"<<*j<<" of factor F"<<I<<endl;

                // ind is the precalculated Index(j,I) i.e. to x_I == k corresponds x_j == ind[k]
                _ind_t* ind = &(index(*j,I));
                // sum_j will be the sum of messages coming into j
                Prob sum_j( g.var(*j).states(), 0.0 ); 
                //if( Props.verbose >= 8)
                    //cout << "\t\tInitialized sum_j = "<< sum_j << "(j=" << *j << ")" << endl;

                for( FactorGraph::nb_cit J = g.nbV(*j).begin(); J != g.nbV(*j).end(); J++ ) 
                    if( *J != I ) {     
                        // for all J in nb(j) \ I 
                        //if( Props.verbose >= 5)
                            //cout << "\t\tneighbor factor F"<<*J<<" of variable v"<<*j<<endl;
                        // message(*j,*J) is the (previous) message received by j from J.
                        const Prob & m =  message(*j,*J);
                        //if( Props.verbose >= 5)
                            //cout << "\t\tPrev. message from  F" <<*J<< " -> v" <<*j<< " = " <<m<<endl;
                        sum_j += m;
                        //if( Props.verbose >= 7)
                            //cout << "\t\tsum_j = "<< sum_j <<endl;
                    } 

                // add sum_j to sum
                //if( Props.verbose >= 6)
                    //cout << "\tadding sum_j = "<< sum_j << " to sum = " << sum << endl;
                    
                //we need to add sum_j[k] to all entries sum[r] in sum that are consistent with sum_j[k],
                //i.e., all entries where variable j has state k.
                for( size_t r = 0; r < sum.size(); r++ )
                {
                    //size_t sum_j_index = (*ind)[r];
                    //if( Props.verbose >= 9)
                        //cout << "\t\tr="<<r<<", sum_j_index="<<sum_j_index<<endl;
                    sum[r] += sum_j[(*ind)[r]];
                }
        
            }
     
        //if( Props.verbose >= 6)
            //cout<<"\tsum = " << sum << endl;
        //old slow code....
        //Factor sum_factor ( g.factor( I ).vars(), sum);//create a factor...
        ////...which allows use to easily take the max:
        //Factor max_f = sum_factor.partMax(g.var(i)); //here we take the Max

        //make all changes directly to the new messages:
        Prob & newm = _newmessages[iI];
        //initialize to -infty
        for( size_t i = 0; i < newm.size(); i++)
            newm[i] = -INFINITY;

        //now we compute the max inline (it's an inline version of factor::partMax )
        const VarSet & ns = g.var(i);
        const VarSet & vs = g.factor( I ).vars();
        //Prob res( g.var(i).states(), -INFINITY );
        //Index i_res( ns, vs );
        //for( size_t i = 0; i < sum.size(); i++, ++i_res )
            //res[i_res] = std::max(res[i_res], sum[i]);

        Index i_newm( ns, vs );
        for( size_t i = 0; i < sum.size(); i++, ++i_newm )
            newm[i_newm] = std::max(newm[i_newm], sum[i]);

        //Prob max = max_f.p(); //here we get the desired vector (Prob) repres.
        //Prob & max = res; 
        //if( Props.verbose >= 7)
            //cout << "\t\tsum_factor = "<<sum_factor<<", max = "<<max<<endl;

        // substract average of messages to stop growing
        //size_t s = max.size();
        //double avg = max.totalSum() / s;
        //Prob newm = max - Prob(s, avg); // compute the new normalized message

        double avg = newm.totalSum() / newm.size();
        for( size_t i = 0; i < newm.size(); i++)
            newm[i] -= avg;
        

        // Store result
        //_newmessages[iI] = newm;

        if( Props.verbose >= 6)
            cout << "\tnew Mess F"<< I <<" -> v"<< i<<" = "<<_newmessages[iI]<<endl;
    }